

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O2

void __thiscall
CP::priority_queue<int,_std::less<int>_>::fixUp
          (priority_queue<int,_std::less<int>_> *this,size_t idx)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  
  piVar2 = this->mData;
  iVar1 = piVar2[idx];
  while (idx != 0) {
    uVar3 = idx - 1 >> 1;
    if (iVar1 < piVar2[uVar3]) break;
    piVar2[idx] = piVar2[uVar3];
    idx = uVar3;
  }
  piVar2[idx] = iVar1;
  return;
}

Assistant:

void fixUp(size_t idx) {
      T tmp = mData[idx];
      while (idx > 0) {
        size_t p = (idx - 1) / 2;
        if ( mLess(tmp,mData[p]) ) break;
        mData[idx] = mData[p];
        idx = p;
      }
      mData[idx] = tmp;
    }